

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_mix_2_0_to_5_0(mixed_segment *segment)

{
  undefined8 *puVar1;
  uint32_t i;
  ulong uVar2;
  float fVar3;
  uint32_t frames;
  float local_5c;
  float local_58;
  float local_54;
  float *ce;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  float *r;
  float *l;
  
  puVar1 = (undefined8 *)segment->data;
  frames = 0xffffffff;
  mixed_buffer_request_read(&l,&frames,(mixed_buffer *)*puVar1);
  mixed_buffer_request_read(&r,&frames,(mixed_buffer *)puVar1[1]);
  mixed_buffer_request_write(&fl,&frames,(mixed_buffer *)puVar1[0xe]);
  mixed_buffer_request_write(&fr,&frames,(mixed_buffer *)puVar1[0xf]);
  mixed_buffer_request_write(&rl,&frames,(mixed_buffer *)puVar1[0x10]);
  mixed_buffer_request_write(&rr,&frames,(mixed_buffer *)puVar1[0x11]);
  mixed_buffer_request_write(&ce,&frames,(mixed_buffer *)puVar1[0x12]);
  for (uVar2 = 0; uVar2 < frames; uVar2 = uVar2 + 1) {
    local_58 = l[uVar2];
    local_54 = r[uVar2];
    local_5c = (local_58 + local_54) * 0.5;
    fVar3 = biquad_sample(local_5c,(biquad_data *)((long)puVar1 + 0xe4));
    fl[uVar2] = local_58;
    fr[uVar2] = local_54;
    rl[uVar2] = (local_5c * -0.5 + local_58 + local_58) * 0.571;
    rr[uVar2] = (local_5c * -0.5 + local_54 + local_54) * 0.571;
    ce[uVar2] = fVar3;
  }
  mixed_buffer_finish_read(frames,(mixed_buffer *)*puVar1);
  mixed_buffer_finish_read(frames,(mixed_buffer *)puVar1[1]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0xe]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0xf]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x10]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x11]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar1[0x12]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_5_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr, *restrict ce;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_request_write(&ce, &frames, data->out[MIXED_CENTER]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    float c = (li+ri)*0.5f;
    float ci = biquad_sample(c, &data->lp[0]);
    float rli = 0.571f * (li + (li - 0.5f * c));
    float rri = 0.571f * (ri + (ri - 0.5f * c));

    fl[i] = li;
    fr[i] = ri;
    rl[i] = rli;
    rr[i] = rri;
    ce[i] = ci;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_CENTER]);
  return 1;
}